

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall
HEkk::applyTabooRowOut
          (HEkk *this,vector<double,_std::allocator<double>_> *values,double overwrite_with)

{
  pointer pdVar1;
  pointer pHVar2;
  uint uVar3;
  ulong uVar4;
  
  pHVar2 = (this->bad_basis_change_).
           super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (uint)((ulong)((long)(this->bad_basis_change_).
                               super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar2) >> 5);
  if (0 < (int)uVar3) {
    pdVar1 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    do {
      if (pHVar2->taboo == true) {
        pHVar2->save_value = pdVar1[pHVar2->row_out];
        pdVar1[pHVar2->row_out] = overwrite_with;
      }
      pHVar2 = pHVar2 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void HEkk::applyTabooRowOut(vector<double>& values,
                            const double overwrite_with) {
  assert((HighsInt)values.size() >= lp_.num_row_);
  for (HighsInt iX = 0; iX < (HighsInt)bad_basis_change_.size(); iX++) {
    if (bad_basis_change_[iX].taboo) {
      HighsInt iRow = bad_basis_change_[iX].row_out;
      bad_basis_change_[iX].save_value = values[iRow];
      values[iRow] = overwrite_with;
    }
  }
}